

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

void __thiscall BackwardPass::Optimize(BackwardPass *this)

{
  undefined1 *puVar1;
  BVSparseNode **this_00;
  BasicBlock *block;
  bool bVar2;
  Phase PVar3;
  uint uVar4;
  uint uVar5;
  char16_t *pcVar6;
  BasicBlock **ppBVar7;
  undefined1 local_220 [8];
  NoRecoverMemoryJitArenaAllocator localAlloc;
  FloatSymEquivalenceMap localFloatSymEquivalenceMap;
  NumberTempRepresentativePropertySymMap localNumberTempRepresentativePropertySym;
  BVSparse<Memory::JitArenaAllocator> localNegativeZeroDoesNotMatterBySymId;
  BVSparse<Memory::JitArenaAllocator> localSymUsedOnlyForBitOpsBySymId;
  BVSparse<Memory::JitArenaAllocator> localSymUsedOnlyForNumberBySymId;
  BVSparse<Memory::JitArenaAllocator> localIntOverflowDoesNotMatterBySymId;
  BVSparse<Memory::JitArenaAllocator> localIntOverflowDoesNotMatterInRangeBySymId;
  BVSparse<Memory::JitArenaAllocator> localCandidateSymsRequiredToBeInt;
  BVSparse<Memory::JitArenaAllocator> localCandidateSymsRequiredToBeLossyInt;
  BVSparse<Memory::JitArenaAllocator> localConsiderSymsAsRealUsesInNoImplicitCallUses;
  
  PVar3 = this->tag;
  if (PVar3 == BackwardPhase) {
    uVar4 = Func::GetSourceContextId(this->func);
    uVar5 = Func::GetLocalFunctionId(this->func);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,BackwardPhase,uVar4,uVar5);
    if (bVar2) {
      return;
    }
    PVar3 = this->tag;
  }
  if (PVar3 == CaptureByteCodeRegUsePhase) {
    bVar2 = Js::PhaseIsEnabled::CaptureByteCodeRegUsePhase<Func*>(this->func);
    if (!bVar2) {
      return;
    }
    bVar2 = DoCaptureByteCodeUpwardExposedUsed(this);
    if (!bVar2) {
      return;
    }
    PVar3 = this->tag;
  }
  if (PVar3 == DeadStorePhase) {
    bVar2 = Func::DoLoopFastPaths(this->func);
    if ((!bVar2) || (bVar2 = Func::DoFastPaths(this->func), !bVar2)) {
      puVar1 = &this->func->field_0x240;
      *(uint *)puVar1 = *(uint *)puVar1 & 0xffffffbf;
    }
    InsertArgInsForFormals(this);
    PVar3 = this->tag;
  }
  pcVar6 = L"BE-DeadStore";
  if (PVar3 == BackwardPhase) {
    pcVar6 = L"BE-Backward";
  }
  Memory::NoRecoverMemoryJitArenaAllocator::NoRecoverMemoryJitArenaAllocator
            ((NoRecoverMemoryJitArenaAllocator *)local_220,pcVar6,
             (this->func->m_alloc->super_ArenaAllocator).
             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
             super_ArenaData.pageAllocator,Js::Throw::OutOfMemory);
  this->tempAlloc = (JitArenaAllocator *)local_220;
  bVar2 = IsTraceEnabled(this);
  if (bVar2) {
    Func::DumpHeader(this->func);
  }
  CleanupBackwardPassInfoInFlowGraph(this);
  localNegativeZeroDoesNotMatterBySymId.lastFoundIndex = (Type_conflict)this->tempAlloc;
  localNegativeZeroDoesNotMatterBySymId.alloc =
       (Type)&localNumberTempRepresentativePropertySym.stats;
  localNumberTempRepresentativePropertySym.stats = (Type)0x0;
  localNegativeZeroDoesNotMatterBySymId.head = (Type_conflict)0x0;
  this->negativeZeroDoesNotMatterBySymId =
       (BVSparse<Memory::JitArenaAllocator> *)localNegativeZeroDoesNotMatterBySymId.alloc;
  localSymUsedOnlyForBitOpsBySymId.alloc =
       (Type)&localNegativeZeroDoesNotMatterBySymId.lastUsedNodePrevNextField;
  localNegativeZeroDoesNotMatterBySymId.lastUsedNodePrevNextField = (Type)0x0;
  localSymUsedOnlyForBitOpsBySymId.head = (Type_conflict)0x0;
  this->symUsedOnlyForBitOpsBySymId =
       (BVSparse<Memory::JitArenaAllocator> *)localSymUsedOnlyForBitOpsBySymId.alloc;
  localSymUsedOnlyForNumberBySymId.alloc =
       (Type)&localSymUsedOnlyForBitOpsBySymId.lastUsedNodePrevNextField;
  localSymUsedOnlyForBitOpsBySymId.lastUsedNodePrevNextField = (Type)0x0;
  localSymUsedOnlyForNumberBySymId.head = (Type_conflict)0x0;
  this->symUsedOnlyForNumberBySymId =
       (BVSparse<Memory::JitArenaAllocator> *)localSymUsedOnlyForNumberBySymId.alloc;
  localIntOverflowDoesNotMatterBySymId.alloc =
       (Type)&localSymUsedOnlyForNumberBySymId.lastUsedNodePrevNextField;
  localSymUsedOnlyForNumberBySymId.lastUsedNodePrevNextField = (Type)0x0;
  localIntOverflowDoesNotMatterBySymId.head = (Type_conflict)0x0;
  this->intOverflowDoesNotMatterBySymId =
       (BVSparse<Memory::JitArenaAllocator> *)localIntOverflowDoesNotMatterBySymId.alloc;
  localIntOverflowDoesNotMatterInRangeBySymId.alloc =
       (Type)&localIntOverflowDoesNotMatterBySymId.lastUsedNodePrevNextField;
  localIntOverflowDoesNotMatterBySymId.lastUsedNodePrevNextField = (Type)0x0;
  localIntOverflowDoesNotMatterInRangeBySymId.head = (Type_conflict)0x0;
  this->intOverflowDoesNotMatterInRangeBySymId =
       (BVSparse<Memory::JitArenaAllocator> *)localIntOverflowDoesNotMatterInRangeBySymId.alloc;
  localCandidateSymsRequiredToBeInt.alloc =
       (Type)&localIntOverflowDoesNotMatterInRangeBySymId.lastUsedNodePrevNextField;
  localIntOverflowDoesNotMatterInRangeBySymId.lastUsedNodePrevNextField = (Type)0x0;
  localCandidateSymsRequiredToBeInt.head = (Type_conflict)0x0;
  this->candidateSymsRequiredToBeInt =
       (BVSparse<Memory::JitArenaAllocator> *)localCandidateSymsRequiredToBeInt.alloc;
  localCandidateSymsRequiredToBeLossyInt.alloc =
       (Type)&localCandidateSymsRequiredToBeInt.lastUsedNodePrevNextField;
  localCandidateSymsRequiredToBeInt.lastUsedNodePrevNextField = (Type)0x0;
  localCandidateSymsRequiredToBeLossyInt.head = (Type_conflict)0x0;
  this->candidateSymsRequiredToBeLossyInt =
       (BVSparse<Memory::JitArenaAllocator> *)localCandidateSymsRequiredToBeLossyInt.alloc;
  localCandidateSymsRequiredToBeLossyInt.lastUsedNodePrevNextField = (Type)0x0;
  this->considerSymsAsRealUsesInNoImplicitCallUses =
       (BVSparse<Memory::JitArenaAllocator> *)
       &localCandidateSymsRequiredToBeLossyInt.lastUsedNodePrevNextField;
  this->intOverflowCurrentlyMattersInRange = true;
  this_00 = &localAlloc.super_JitArenaAllocator.bvFreeList;
  localSymUsedOnlyForBitOpsBySymId.lastFoundIndex =
       localNegativeZeroDoesNotMatterBySymId.lastFoundIndex;
  localSymUsedOnlyForNumberBySymId.lastFoundIndex =
       localNegativeZeroDoesNotMatterBySymId.lastFoundIndex;
  localIntOverflowDoesNotMatterBySymId.lastFoundIndex =
       localNegativeZeroDoesNotMatterBySymId.lastFoundIndex;
  localIntOverflowDoesNotMatterInRangeBySymId.lastFoundIndex =
       localNegativeZeroDoesNotMatterBySymId.lastFoundIndex;
  localCandidateSymsRequiredToBeInt.lastFoundIndex =
       localNegativeZeroDoesNotMatterBySymId.lastFoundIndex;
  localCandidateSymsRequiredToBeLossyInt.lastFoundIndex =
       localNegativeZeroDoesNotMatterBySymId.lastFoundIndex;
  JsUtil::
  BaseDictionary<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)this_00,(AllocatorType *)localNegativeZeroDoesNotMatterBySymId.lastFoundIndex,
                   0);
  this->floatSymEquivalenceMap = (FloatSymEquivalenceMap *)this_00;
  JsUtil::
  BaseDictionary<int,_unsigned_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<int,_unsigned_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)&localFloatSymEquivalenceMap.stats,this->tempAlloc,0);
  this->numberTempRepresentativePropertySym =
       (NumberTempRepresentativePropertySymMap *)&localFloatSymEquivalenceMap.stats;
  ppBVar7 = &this->func->m_fg->tailBlock;
  while (block = *ppBVar7, block != (BasicBlock *)0x0) {
    if ((*(ushort *)&block->field_0x18 & 3) != 1) {
      OptBlock(this,block);
    }
    ppBVar7 = &block->prev;
  }
  if (this->tag == DeadStorePhase) {
    uVar4 = Func::GetSourceContextId(this->func);
    uVar5 = Func::GetLocalFunctionId(this->func);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,MemOpPhase,uVar4,uVar5);
    if (!bVar2) {
      RemoveEmptyLoops(this);
    }
  }
  this->func->m_fg->hasBackwardPassInfo = true;
  bVar2 = DoTrackCompoundedIntOverflow(this);
  if (bVar2) {
    SymTable::ClearStackSymScratch(this->func->m_symTable);
  }
  PVar3 = this->tag;
  uVar4 = Func::GetSourceContextId(this->func);
  uVar5 = Func::GetLocalFunctionId(this->func);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01450888,PVar3,uVar4,uVar5);
  if (bVar2) {
    Func::DumpHeader(this->func);
    pcVar6 = L"Deadstore Phase Stats:\n";
    if (this->tag == BackwardPhase) {
      pcVar6 = L"Backward Phase Stats:\n";
    }
    Output::Print(pcVar6);
    bVar2 = DoDeadStore(this);
    if (bVar2) {
      Output::Print(L"  Deadstore              : %3d\n",(ulong)this->numDeadStore);
    }
    bVar2 = DoMarkTempObjects(this);
    if (bVar2) {
      Output::Print(L"  Temp Object            : %3d\n",(ulong)this->numMarkTempObject);
    }
  }
  JsUtil::
  BaseDictionary<int,_unsigned_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<int,_unsigned_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)&localFloatSymEquivalenceMap.stats);
  JsUtil::
  BaseDictionary<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)&localAlloc.super_JitArenaAllocator.bvFreeList);
  BVSparse<Memory::JitArenaAllocator>::~BVSparse
            ((BVSparse<Memory::JitArenaAllocator> *)
             &localCandidateSymsRequiredToBeLossyInt.lastUsedNodePrevNextField);
  BVSparse<Memory::JitArenaAllocator>::~BVSparse
            ((BVSparse<Memory::JitArenaAllocator> *)
             &localCandidateSymsRequiredToBeInt.lastUsedNodePrevNextField);
  BVSparse<Memory::JitArenaAllocator>::~BVSparse
            ((BVSparse<Memory::JitArenaAllocator> *)
             &localIntOverflowDoesNotMatterInRangeBySymId.lastUsedNodePrevNextField);
  BVSparse<Memory::JitArenaAllocator>::~BVSparse
            ((BVSparse<Memory::JitArenaAllocator> *)
             &localIntOverflowDoesNotMatterBySymId.lastUsedNodePrevNextField);
  BVSparse<Memory::JitArenaAllocator>::~BVSparse
            ((BVSparse<Memory::JitArenaAllocator> *)
             &localSymUsedOnlyForNumberBySymId.lastUsedNodePrevNextField);
  BVSparse<Memory::JitArenaAllocator>::~BVSparse
            ((BVSparse<Memory::JitArenaAllocator> *)
             &localSymUsedOnlyForBitOpsBySymId.lastUsedNodePrevNextField);
  BVSparse<Memory::JitArenaAllocator>::~BVSparse
            ((BVSparse<Memory::JitArenaAllocator> *)
             &localNegativeZeroDoesNotMatterBySymId.lastUsedNodePrevNextField);
  BVSparse<Memory::JitArenaAllocator>::~BVSparse
            ((BVSparse<Memory::JitArenaAllocator> *)&localNumberTempRepresentativePropertySym.stats)
  ;
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)local_220);
  return;
}

Assistant:

void
BackwardPass::Optimize()
{
    if (tag == Js::BackwardPhase && PHASE_OFF(tag, this->func))
    {
        return;
    }

    if (tag == Js::CaptureByteCodeRegUsePhase && (!PHASE_ENABLED(CaptureByteCodeRegUsePhase, this->func) || !DoCaptureByteCodeUpwardExposedUsed()))
    {
        return;
    }

    if (tag == Js::DeadStorePhase)
    {
        if (!this->func->DoLoopFastPaths() || !this->func->DoFastPaths())
        {
            //arguments[] access is similar to array fast path hence disable when array fastpath is disabled.
            //loopFastPath is always true except explicitly disabled
            //defaultDoFastPath can be false when we the source code size is huge
            func->SetHasStackArgs(false);
        }
        InsertArgInsForFormals();
    }

    NoRecoverMemoryJitArenaAllocator localAlloc(tag == Js::BackwardPhase? _u("BE-Backward") : _u("BE-DeadStore"),
        this->func->m_alloc->GetPageAllocator(), Js::Throw::OutOfMemory);

    this->tempAlloc = &localAlloc;
#if DBG_DUMP
    if (this->IsTraceEnabled())
    {
        this->func->DumpHeader();
    }
#endif

    this->CleanupBackwardPassInfoInFlowGraph();

    // Info about whether a sym is used in a way in which -0 differs from +0, or whether the sym is used in a way in which an
    // int32 overflow when generating the value of the sym matters, in the current block. The info is transferred to
    // instructions that define the sym in the current block as they are encountered. The info in these bit vectors is discarded
    // after optimizing each block, so the only info that remains for GlobOpt is that which is transferred to instructions.
    BVSparse<JitArenaAllocator> localNegativeZeroDoesNotMatterBySymId(tempAlloc);
    negativeZeroDoesNotMatterBySymId = &localNegativeZeroDoesNotMatterBySymId;

    BVSparse<JitArenaAllocator> localSymUsedOnlyForBitOpsBySymId(tempAlloc);
    symUsedOnlyForBitOpsBySymId = &localSymUsedOnlyForBitOpsBySymId;
    BVSparse<JitArenaAllocator> localSymUsedOnlyForNumberBySymId(tempAlloc);
    symUsedOnlyForNumberBySymId = &localSymUsedOnlyForNumberBySymId;

    BVSparse<JitArenaAllocator> localIntOverflowDoesNotMatterBySymId(tempAlloc);
    intOverflowDoesNotMatterBySymId = &localIntOverflowDoesNotMatterBySymId;
    BVSparse<JitArenaAllocator> localIntOverflowDoesNotMatterInRangeBySymId(tempAlloc);
    intOverflowDoesNotMatterInRangeBySymId = &localIntOverflowDoesNotMatterInRangeBySymId;
    BVSparse<JitArenaAllocator> localCandidateSymsRequiredToBeInt(tempAlloc);
    candidateSymsRequiredToBeInt = &localCandidateSymsRequiredToBeInt;
    BVSparse<JitArenaAllocator> localCandidateSymsRequiredToBeLossyInt(tempAlloc);
    candidateSymsRequiredToBeLossyInt = &localCandidateSymsRequiredToBeLossyInt;
    BVSparse<JitArenaAllocator> localConsiderSymsAsRealUsesInNoImplicitCallUses(tempAlloc);
    considerSymsAsRealUsesInNoImplicitCallUses = &localConsiderSymsAsRealUsesInNoImplicitCallUses;
    intOverflowCurrentlyMattersInRange = true;

    FloatSymEquivalenceMap localFloatSymEquivalenceMap(tempAlloc);
    floatSymEquivalenceMap = &localFloatSymEquivalenceMap;

    NumberTempRepresentativePropertySymMap localNumberTempRepresentativePropertySym(tempAlloc);
    numberTempRepresentativePropertySym = &localNumberTempRepresentativePropertySym;

    FOREACH_BLOCK_BACKWARD_IN_FUNC_DEAD_OR_ALIVE(block, this->func)
    {
        this->OptBlock(block);
    }
    NEXT_BLOCK_BACKWARD_IN_FUNC_DEAD_OR_ALIVE;

    if (this->tag == Js::DeadStorePhase && !PHASE_OFF(Js::MemOpPhase, this->func))
    {
        this->RemoveEmptyLoops();
    }
    this->func->m_fg->hasBackwardPassInfo = true;

    if(DoTrackCompoundedIntOverflow())
    {
        // Tracking int overflow makes use of a scratch field in stack syms, which needs to be cleared
        func->m_symTable->ClearStackSymScratch();
    }

#if DBG_DUMP
    if (PHASE_STATS(this->tag, this->func))
    {
        this->func->DumpHeader();
        Output::Print(this->tag == Js::BackwardPhase? _u("Backward Phase Stats:\n") : _u("Deadstore Phase Stats:\n"));
        if (this->DoDeadStore())
        {
            Output::Print(_u("  Deadstore              : %3d\n"), this->numDeadStore);
        }
        if (this->DoMarkTempNumbers())
        {
            Output::Print(_u("  Temp Number            : %3d\n"), this->numMarkTempNumber);
            Output::Print(_u("  Transferred Temp Number: %3d\n"), this->numMarkTempNumberTransferred);
        }
        if (this->DoMarkTempObjects())
        {
            Output::Print(_u("  Temp Object            : %3d\n"), this->numMarkTempObject);
        }
    }
#endif
}